

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void CTcTokenizer::skip_ws_and_markers(utf8_ptr *p)

{
  wchar_t c;
  int iVar1;
  
  while( true ) {
    while( true ) {
      c = utf8_ptr::getch(p);
      if (c != L'\x03') break;
      p->p_ = p->p_ + 9;
    }
    iVar1 = is_space(c);
    if (iVar1 == 0) break;
    utf8_ptr::inc(p);
  }
  return;
}

Assistant:

void CTcTokenizer::skip_ws_and_markers(utf8_ptr *p)
{
    /* keep going until we find something interesting */
    for (;;)
    {
        wchar_t cur;

        /* get the current character */
        cur = p->getch();

        /* 
         *   if it's a macro expansion end marker, skip it as though it
         *   were whitespace; otherwise, if it's whitespace, skip it;
         *   otherwise, we're done skipping leading whitespace 
         */
        if (cur == TOK_MACRO_EXP_END)
        {
            /* skip the embedded pointer value that follows */
            p->set(p->getptr() + 1 + sizeof(CTcHashEntryPp *));
        }
        else if (is_space(cur))
        {
            /* skip the space */
            p->inc();
        }
        else
        {
            /* it's not whitespace or equivalent - we're done */
            return;
        }
    }
}